

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate-a64.c
# Opt level: O0

void disas_simd_indexed(DisasContext_conflict1 *s,uint32_t insn)

{
  TCGContext_conflict1 *tcg_ctx_00;
  TCGv_ptr ptr;
  _Bool is_f16;
  _Bool _Var1;
  uint32_t uVar2;
  uint32_t uVar3;
  uint32_t uVar4;
  uint32_t uVar5;
  uint32_t uVar6;
  int iVar7;
  uint32_t uVar8;
  code *pcVar9;
  TCGv_i64 pTVar10;
  TCGv_i64 pTVar11;
  TCGv_i64 pTVar12;
  TCGv_i32 pTVar13;
  TCGv_i32 pTVar14;
  TCGv_i32 tcg_dest;
  bool bVar15;
  bool is_q_00;
  bool bVar16;
  bool bVar17;
  MemOp local_23c;
  MemOp local_21c;
  MemOp local_1f4;
  MemOp local_1cc;
  TCGv_i64 local_130;
  TCGv_i64 tcg_passres_1;
  TCGv_i32 tcg_op_3;
  TCGv_i32 tcg_idx_3;
  TCGv_i64 pTStack_110;
  int passelt;
  TCGv_i64 tcg_passres;
  TCGv_i64 tcg_op_2;
  TCGv_i64 tcg_idx_2;
  MemOp memop;
  _Bool satop;
  TCGv_i64 pTStack_e8;
  int pass_2;
  TCGv_i64 tcg_res_2 [2];
  _Bool is_sub;
  NeonGenTwoOpFn *genfn;
  TCGv_i32 tcg_res_1;
  TCGv_i32 tcg_op_1;
  int maxpasses;
  int pass_1;
  TCGv_i32 tcg_idx_1;
  TCGv_i64 tcg_res;
  TCGv_i64 tcg_op;
  int pass;
  TCGv_i64 tcg_idx;
  int data_1;
  int is_2;
  int is_s;
  int data;
  int rot;
  TCGv_ptr fpst;
  int index;
  _Bool is_fp16;
  int is_fp;
  _Bool is_long;
  int rd;
  int rn;
  int h;
  int opcode;
  int rm;
  int m;
  int l;
  int size;
  _Bool u;
  _Bool is_q;
  _Bool is_scalar;
  TCGContext_conflict1 *tcg_ctx;
  uint32_t insn_local;
  DisasContext_conflict1 *s_local;
  
  tcg_ctx_00 = s->uc->tcg_ctx;
  uVar2 = extract32(insn,0x1c,1);
  bVar15 = uVar2 != 0;
  uVar2 = extract32(insn,0x1e,1);
  is_q_00 = uVar2 != 0;
  uVar2 = extract32(insn,0x1d,1);
  bVar16 = uVar2 != 0;
  m = extract32(insn,0x16,2);
  uVar2 = extract32(insn,0x15,1);
  uVar3 = extract32(insn,0x14,1);
  h = extract32(insn,0x10,4);
  uVar4 = extract32(insn,0xc,4);
  fpst._4_4_ = extract32(insn,0xb,1);
  uVar5 = extract32(insn,5,5);
  uVar6 = extract32(insn,0,5);
  bVar17 = false;
  index = 0;
  is_f16 = false;
  switch((uint)bVar16 * 0x10 + uVar4) {
  case 0:
  case 4:
  case 0x18:
  case 0x1c:
    if (((bVar15) || (m != 2)) || (_Var1 = isar_feature_aa64_fhm(s->isar), !_Var1)) {
      unallocated_encoding_aarch64(s);
      return;
    }
    m = 1;
    break;
  case 1:
  case 5:
  case 9:
  case 0x19:
    index = 1;
    break;
  case 2:
  case 6:
  case 10:
  case 0x12:
  case 0x16:
  case 0x1a:
    if (bVar15) {
      unallocated_encoding_aarch64(s);
      return;
    }
    bVar17 = true;
    break;
  case 3:
  case 7:
  case 0xb:
    bVar17 = true;
    break;
  case 8:
  case 0x10:
  case 0x14:
    if (bVar15) {
      unallocated_encoding_aarch64(s);
      return;
    }
    break;
  case 0xc:
  case 0xd:
    break;
  case 0xe:
  case 0x1e:
    if (((bVar15) || (m != 2)) || (_Var1 = isar_feature_aa64_dp(s->isar), !_Var1)) {
      unallocated_encoding_aarch64(s);
      return;
    }
    break;
  default:
    unallocated_encoding_aarch64(s);
    return;
  case 0x11:
  case 0x13:
  case 0x15:
  case 0x17:
    if ((bVar15) || (_Var1 = isar_feature_aa64_fcma(s->isar), !_Var1)) {
      unallocated_encoding_aarch64(s);
      return;
    }
    index = 2;
    break;
  case 0x1d:
  case 0x1f:
    _Var1 = isar_feature_aa64_rdm(s->isar);
    if (!_Var1) {
      unallocated_encoding_aarch64(s);
      return;
    }
  }
  if (index == 1) {
    if (m == 0) {
      m = 1;
      is_f16 = true;
    }
    else if (1 < m - 2U) {
      unallocated_encoding_aarch64(s);
      return;
    }
  }
  else if (index == 2) {
    m = m + 1;
    if (m == 2) {
      if ((fpst._4_4_ != 0) && (!is_q_00)) {
        unallocated_encoding_aarch64(s);
        return;
      }
      is_f16 = true;
    }
    else if (m != 3) {
      unallocated_encoding_aarch64(s);
      return;
    }
  }
  else if ((m == 0) || (m == 3)) {
    unallocated_encoding_aarch64(s);
    return;
  }
  if ((is_f16 != false) && (_Var1 = isar_feature_aa64_fp16(s->isar), !_Var1)) {
    unallocated_encoding_aarch64(s);
    return;
  }
  if (m == 1) {
    fpst._4_4_ = fpst._4_4_ << 2 | uVar2 << 1 | uVar3;
  }
  else if (m == 2) {
    fpst._4_4_ = fpst._4_4_ << 1 | uVar2;
    h = uVar3 << 4 | h;
  }
  else {
    if (m != 3) {
      g_assertion_message_expr
                ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                 ,0x343f,(char *)0x0);
    }
    if ((uVar2 != 0) || (!is_q_00)) {
      unallocated_encoding_aarch64(s);
      return;
    }
    h = uVar3 << 4 | h;
  }
  _Var1 = fp_access_check(s);
  if (!_Var1) {
    return;
  }
  if (index == 0) {
    _data = (TCGv_ptr)0x0;
  }
  else {
    _data = get_fpstatus_ptr_aarch64(tcg_ctx_00,is_f16);
  }
  iVar7 = (uint)bVar16 * 0x10 + uVar4;
  if ((iVar7 == 0) || (iVar7 == 4)) {
LAB_008320e3:
    uVar2 = extract32(uVar4,2,1);
    uVar3 = vec_full_reg_offset(s,uVar6);
    uVar4 = vec_full_reg_offset(s,uVar5);
    uVar5 = vec_full_reg_offset(s,h);
    ptr = tcg_ctx_00->cpu_env;
    uVar6 = 8;
    if (is_q_00) {
      uVar6 = 0x10;
    }
    uVar8 = vec_full_reg_size(s);
    tcg_gen_gvec_3_ptr_aarch64
              (tcg_ctx_00,uVar3,uVar4,uVar5,ptr,uVar6,uVar8,
               fpst._4_4_ << 2 | (uint)bVar16 << 1 | uVar2,gen_helper_gvec_fmlal_idx_a64);
  }
  else {
    if (iVar7 != 0xe) {
      if ((((iVar7 == 0x11) || (iVar7 == 0x13)) || (iVar7 == 0x15)) || (iVar7 == 0x17)) {
        uVar2 = extract32(insn,0xd,2);
        uVar3 = vec_full_reg_offset(s,uVar6);
        uVar4 = vec_full_reg_offset(s,uVar5);
        uVar5 = vec_full_reg_offset(s,h);
        uVar6 = 8;
        if (is_q_00) {
          uVar6 = 0x10;
        }
        uVar8 = vec_full_reg_size(s);
        pcVar9 = gen_helper_gvec_fcmlah_idx;
        if (m == 3) {
          pcVar9 = gen_helper_gvec_fcmlas_idx;
        }
        tcg_gen_gvec_3_ptr_aarch64
                  (tcg_ctx_00,uVar3,uVar4,uVar5,_data,uVar6,uVar8,fpst._4_4_ << 2 | uVar2,pcVar9);
        tcg_temp_free_ptr(tcg_ctx_00,_data);
        return;
      }
      if ((iVar7 == 0x18) || (iVar7 == 0x1c)) goto LAB_008320e3;
      if (iVar7 != 0x1e) {
        if (m == 3) {
          pTVar10 = tcg_temp_new_i64(tcg_ctx_00);
          if (((index == 0) || (!is_q_00)) || (bVar17)) {
            __assert_fail("is_fp && is_q && !is_long",
                          "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                          ,0x347a,"void disas_simd_indexed(DisasContext *, uint32_t)");
          }
          read_vec_element(s,pTVar10,h,fpst._4_4_,MO_64);
          tcg_op._4_4_ = 0;
          while( true ) {
            iVar7 = 2;
            if (bVar15) {
              iVar7 = 1;
            }
            if (iVar7 <= tcg_op._4_4_) break;
            pTVar11 = tcg_temp_new_i64(tcg_ctx_00);
            pTVar12 = tcg_temp_new_i64(tcg_ctx_00);
            read_vec_element(s,pTVar11,uVar5,tcg_op._4_4_,MO_64);
            switch((uint)bVar16 * 0x10 + -1 + uVar4) {
            default:
              g_assertion_message_expr
                        ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                         ,0x3494,(char *)0x0);
            case 4:
              gen_helper_vfp_negd(tcg_ctx_00,pTVar11,pTVar11);
            case 0:
              read_vec_element(s,pTVar12,uVar6,tcg_op._4_4_,MO_64);
              gen_helper_vfp_muladdd(tcg_ctx_00,pTVar12,pTVar11,pTVar10,pTVar12,_data);
              break;
            case 8:
              gen_helper_vfp_muld(tcg_ctx_00,pTVar12,pTVar11,pTVar10,_data);
              break;
            case 0x18:
              gen_helper_vfp_mulxd(tcg_ctx_00,pTVar12,pTVar11,pTVar10,_data);
            }
            write_vec_element(s,pTVar12,uVar6,tcg_op._4_4_,MO_64);
            tcg_temp_free_i64(tcg_ctx_00,pTVar11);
            tcg_temp_free_i64(tcg_ctx_00,pTVar12);
            tcg_op._4_4_ = tcg_op._4_4_ + 1;
          }
          tcg_temp_free_i64(tcg_ctx_00,pTVar10);
          clear_vec_high(s,(_Bool)((bVar15 ^ 0xffU) & 1),uVar6);
        }
        else {
          if (bVar17) {
            uVar2 = extract32(uVar4,0,1);
            bVar17 = uVar2 != 0;
            tcg_idx_2._4_4_ = MO_32;
            if ((bVar17) || (!bVar16)) {
              tcg_idx_2._4_4_ = MO_LESL;
            }
            if (m != 2) {
              pTVar13 = tcg_temp_new_i32(tcg_ctx_00);
              if (m != 1) {
                __assert_fail("size == 1",
                              "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                              ,0x35a1,"void disas_simd_indexed(DisasContext *, uint32_t)");
              }
              read_vec_element_i32(s,pTVar13,h,fpst._4_4_,MO_16);
              if (!bVar15) {
                tcg_gen_deposit_i32_aarch64(tcg_ctx_00,pTVar13,pTVar13,pTVar13,0x10,0x10);
              }
              memop = MO_8;
              do {
                iVar7 = 2;
                if (bVar15) {
                  iVar7 = 1;
                }
                if (iVar7 <= (int)memop) {
                  tcg_temp_free_i32(tcg_ctx_00,pTVar13);
                  if (bVar15) {
                    tcg_gen_ext32u_i64_aarch64(tcg_ctx_00,pTStack_e8,pTStack_e8);
                  }
                  goto LAB_00833310;
                }
                pTVar14 = tcg_temp_new_i32(tcg_ctx_00);
                if (bVar15) {
                  read_vec_element_i32(s,pTVar14,uVar5,memop,MO_16);
                }
                else {
                  read_vec_element_i32(s,pTVar14,uVar5,memop + (uint)is_q_00 * 2,MO_32);
                }
                pTVar10 = tcg_temp_new_i64(tcg_ctx_00);
                *(TCGv_i64 *)((long)&stack0xffffffffffffff18 + (long)(int)memop * 8) = pTVar10;
                if ((uVar4 == 10) || (uVar4 == 0xb)) {
                  local_130 = *(TCGv_i64 *)((long)&stack0xffffffffffffff18 + (long)(int)memop * 8);
                }
                else {
                  local_130 = tcg_temp_new_i64(tcg_ctx_00);
                }
                if ((tcg_idx_2._4_4_ & MO_ASHIFT) == MO_8) {
                  gen_helper_neon_mull_u16(tcg_ctx_00,local_130,pTVar14,pTVar13);
                }
                else {
                  gen_helper_neon_mull_s16(tcg_ctx_00,local_130,pTVar14,pTVar13);
                }
                if (bVar17) {
                  gen_helper_neon_addl_saturate_s32
                            (tcg_ctx_00,local_130,tcg_ctx_00->cpu_env,local_130,local_130);
                }
                tcg_temp_free_i32(tcg_ctx_00,pTVar14);
                if ((uVar4 != 10) && (uVar4 != 0xb)) {
                  read_vec_element(s,*(TCGv_i64 *)
                                      ((long)&stack0xffffffffffffff18 + (long)(int)memop * 8),uVar6,
                                   memop,MO_64);
                  if (4 < uVar4 - 2 && uVar4 != 7) {
LAB_008332a8:
                    g_assertion_message_expr
                              ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                               ,0x35e4,(char *)0x0);
                  }
                  switch((long)&switchD_008331ef::switchdataD_0137bb50 +
                         (long)(int)(&switchD_008331ef::switchdataD_0137bb50)[uVar4 - 2]) {
                  case 0x8331f1:
                    gen_helper_neon_addl_u32
                              (tcg_ctx_00,
                               *(TCGv_i64 *)((long)&stack0xffffffffffffff18 + (long)(int)memop * 8),
                               *(TCGv_i64 *)((long)&stack0xffffffffffffff18 + (long)(int)memop * 8),
                               local_130);
                    break;
                  case 0x833224:
                    gen_helper_neon_subl_u32
                              (tcg_ctx_00,
                               *(TCGv_i64 *)((long)&stack0xffffffffffffff18 + (long)(int)memop * 8),
                               *(TCGv_i64 *)((long)&stack0xffffffffffffff18 + (long)(int)memop * 8),
                               local_130);
                    break;
                  case 0x833254:
                    gen_helper_neon_negl_u32(tcg_ctx_00,local_130,local_130);
                  case 0x83326b:
                    gen_helper_neon_addl_saturate_s32
                              (tcg_ctx_00,
                               *(TCGv_i64 *)((long)&stack0xffffffffffffff18 + (long)(int)memop * 8),
                               tcg_ctx_00->cpu_env,
                               *(TCGv_i64 *)((long)&stack0xffffffffffffff18 + (long)(int)memop * 8),
                               local_130);
                    break;
                  case 0x8332a6:
                    goto LAB_008332a8;
                  }
                  tcg_temp_free_i64(tcg_ctx_00,local_130);
                }
                memop = memop + MO_16;
              } while( true );
            }
            pTVar10 = tcg_temp_new_i64(tcg_ctx_00);
            read_vec_element(s,pTVar10,h,fpst._4_4_,tcg_idx_2._4_4_);
            memop = MO_8;
            do {
              iVar7 = 2;
              if (bVar15) {
                iVar7 = 1;
              }
              if (iVar7 <= (int)memop) {
                tcg_temp_free_i64(tcg_ctx_00,pTVar10);
                clear_vec_high(s,(_Bool)((bVar15 ^ 0xffU) & 1),uVar6);
LAB_00833310:
                if (bVar15) {
                  tcg_res_2[0] = tcg_const_i64_aarch64(tcg_ctx_00,0);
                }
                for (memop = MO_8; (int)memop < 2; memop = memop + MO_16) {
                  write_vec_element(s,*(TCGv_i64 *)
                                       ((long)&stack0xffffffffffffff18 + (long)(int)memop * 8),uVar6
                                    ,memop,MO_64);
                  tcg_temp_free_i64(tcg_ctx_00,
                                    *(TCGv_i64 *)
                                     ((long)&stack0xffffffffffffff18 + (long)(int)memop * 8));
                }
                goto LAB_00833391;
              }
              pTVar11 = tcg_temp_new_i64(tcg_ctx_00);
              if (bVar15) {
                tcg_idx_3._4_4_ = 0;
              }
              else {
                tcg_idx_3._4_4_ = memop + (uint)is_q_00 * 2;
              }
              read_vec_element(s,pTVar11,uVar5,tcg_idx_3._4_4_,tcg_idx_2._4_4_);
              pTVar12 = tcg_temp_new_i64(tcg_ctx_00);
              *(TCGv_i64 *)((long)&stack0xffffffffffffff18 + (long)(int)memop * 8) = pTVar12;
              if ((uVar4 == 10) || (uVar4 == 0xb)) {
                pTStack_110 = *(TCGv_i64 *)((long)&stack0xffffffffffffff18 + (long)(int)memop * 8);
              }
              else {
                pTStack_110 = tcg_temp_new_i64(tcg_ctx_00);
              }
              tcg_gen_mul_i64_aarch64(tcg_ctx_00,pTStack_110,pTVar11,pTVar10);
              tcg_temp_free_i64(tcg_ctx_00,pTVar11);
              if (bVar17) {
                gen_helper_neon_addl_saturate_s64
                          (tcg_ctx_00,pTStack_110,tcg_ctx_00->cpu_env,pTStack_110,pTStack_110);
              }
              if ((uVar4 != 10) && (uVar4 != 0xb)) {
                read_vec_element(s,*(TCGv_i64 *)
                                    ((long)&stack0xffffffffffffff18 + (long)(int)memop * 8),uVar6,
                                 memop,MO_64);
                if (4 < uVar4 - 2 && uVar4 != 7) {
LAB_00832f41:
                  g_assertion_message_expr
                            ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                             ,0x3597,(char *)0x0);
                }
                switch((long)&switchD_00832e88::switchdataD_0137bb68 +
                       (long)(int)(&switchD_00832e88::switchdataD_0137bb68)[uVar4 - 2]) {
                case 0x832e8a:
                  tcg_gen_add_i64(tcg_ctx_00,
                                  *(TCGv_i64 *)
                                   ((long)&stack0xffffffffffffff18 + (long)(int)memop * 8),
                                  *(TCGv_i64 *)
                                   ((long)&stack0xffffffffffffff18 + (long)(int)memop * 8),
                                  pTStack_110);
                  break;
                case 0x832ebd:
                  tcg_gen_sub_i64(tcg_ctx_00,
                                  *(TCGv_i64 *)
                                   ((long)&stack0xffffffffffffff18 + (long)(int)memop * 8),
                                  *(TCGv_i64 *)
                                   ((long)&stack0xffffffffffffff18 + (long)(int)memop * 8),
                                  pTStack_110);
                  break;
                case 0x832eed:
                  tcg_gen_neg_i64(tcg_ctx_00,pTStack_110,pTStack_110);
                case 0x832f04:
                  gen_helper_neon_addl_saturate_s64
                            (tcg_ctx_00,
                             *(TCGv_i64 *)((long)&stack0xffffffffffffff18 + (long)(int)memop * 8),
                             tcg_ctx_00->cpu_env,
                             *(TCGv_i64 *)((long)&stack0xffffffffffffff18 + (long)(int)memop * 8),
                             pTStack_110);
                  break;
                case 0x832f3f:
                  goto LAB_00832f41;
                }
                tcg_temp_free_i64(tcg_ctx_00,pTStack_110);
              }
              memop = memop + MO_16;
            } while( true );
          }
          pTVar13 = tcg_temp_new_i32(tcg_ctx_00);
          if (bVar15) {
            tcg_op_1._0_4_ = 1;
          }
          else {
            tcg_op_1._0_4_ = 2;
            if (is_q_00) {
              tcg_op_1._0_4_ = 4;
            }
          }
          read_vec_element_i32(s,pTVar13,h,fpst._4_4_,m);
          if ((m == 1) && (!bVar15)) {
            tcg_gen_deposit_i32_aarch64(tcg_ctx_00,pTVar13,pTVar13,pTVar13,0x10,0x10);
          }
          for (tcg_op_1._4_4_ = 0; tcg_op_1._4_4_ < (int)tcg_op_1;
              tcg_op_1._4_4_ = tcg_op_1._4_4_ + 1) {
            pTVar14 = tcg_temp_new_i32(tcg_ctx_00);
            tcg_dest = tcg_temp_new_i32(tcg_ctx_00);
            if (bVar15) {
              local_1cc = m;
            }
            else {
              local_1cc = MO_32;
            }
            read_vec_element_i32(s,pTVar14,uVar5,tcg_op_1._4_4_,local_1cc);
            switch((uint)bVar16 * 0x10 + -1 + uVar4) {
            case 0:
            case 4:
              if (bVar15) {
                local_1f4 = m;
              }
              else {
                local_1f4 = MO_32;
              }
              read_vec_element_i32(s,tcg_dest,uVar6,tcg_op_1._4_4_,local_1f4);
              if (m == 1) {
                if (uVar4 == 5) {
                  tcg_gen_xori_i32_aarch64(tcg_ctx_00,pTVar14,pTVar14,-0x7fff8000);
                }
                if (bVar15) {
                  gen_helper_advsimd_muladdh(tcg_ctx_00,tcg_dest,pTVar14,pTVar13,tcg_dest,_data);
                }
                else {
                  gen_helper_advsimd_muladd2h(tcg_ctx_00,tcg_dest,pTVar14,pTVar13,tcg_dest,_data);
                }
              }
              else {
                if (m != 2) {
                  g_assertion_message_expr
                            ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                             ,0x34f2,(char *)0x0);
                }
                if (uVar4 == 5) {
                  tcg_gen_xori_i32_aarch64(tcg_ctx_00,pTVar14,pTVar14,-0x80000000);
                }
                gen_helper_vfp_muladds(tcg_ctx_00,tcg_dest,pTVar14,pTVar13,tcg_dest,_data);
              }
              break;
            default:
              g_assertion_message_expr
                        ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                         ,0x3542,(char *)0x0);
            case 7:
            case 0xf:
            case 0x13:
              tcg_res_2[1]._7_1_ = uVar4 == 4;
              if (m == 1) {
                gen_helper_neon_mul_u16(tcg_ctx_00,tcg_dest,pTVar14,pTVar13);
              }
              else {
                tcg_gen_mul_i32(tcg_ctx_00,tcg_dest,pTVar14,pTVar13);
              }
              if (uVar4 != 8) {
                read_vec_element_i32(s,pTVar14,uVar6,tcg_op_1._4_4_,MO_32);
                (*disas_simd_indexed::fns[m + -1][tcg_res_2[1]._7_1_ & 1])
                          (tcg_ctx_00,tcg_dest,pTVar14,tcg_dest);
              }
              break;
            case 8:
              if (m == 1) {
                if (bVar15) {
                  gen_helper_advsimd_mulh(tcg_ctx_00,tcg_dest,pTVar14,pTVar13,_data);
                }
                else {
                  gen_helper_advsimd_mul2h(tcg_ctx_00,tcg_dest,pTVar14,pTVar13,_data);
                }
              }
              else {
                if (m != 2) {
                  g_assertion_message_expr
                            ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                             ,0x3504,(char *)0x0);
                }
                gen_helper_vfp_muls(tcg_ctx_00,tcg_dest,pTVar14,pTVar13,_data);
              }
              break;
            case 0xb:
              if (m == 1) {
                gen_helper_neon_qdmulh_s16(tcg_ctx_00,tcg_dest,tcg_ctx_00->cpu_env,pTVar14,pTVar13);
              }
              else {
                gen_helper_neon_qdmulh_s32(tcg_ctx_00,tcg_dest,tcg_ctx_00->cpu_env,pTVar14,pTVar13);
              }
              break;
            case 0xc:
              if (m == 1) {
                gen_helper_neon_qrdmulh_s16(tcg_ctx_00,tcg_dest,tcg_ctx_00->cpu_env,pTVar14,pTVar13)
                ;
              }
              else {
                gen_helper_neon_qrdmulh_s32(tcg_ctx_00,tcg_dest,tcg_ctx_00->cpu_env,pTVar14,pTVar13)
                ;
              }
              break;
            case 0x18:
              if (m == 1) {
                if (bVar15) {
                  gen_helper_advsimd_mulxh(tcg_ctx_00,tcg_dest,pTVar14,pTVar13,_data);
                }
                else {
                  gen_helper_advsimd_mulx2h(tcg_ctx_00,tcg_dest,pTVar14,pTVar13,_data);
                }
              }
              else {
                if (m != 2) {
                  g_assertion_message_expr
                            ("/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/target/arm/translate-a64.c"
                             ,0x3516,(char *)0x0);
                }
                gen_helper_vfp_mulxs(tcg_ctx_00,tcg_dest,pTVar14,pTVar13,_data);
              }
              break;
            case 0x1c:
              if (bVar15) {
                local_21c = m;
              }
              else {
                local_21c = MO_32;
              }
              read_vec_element_i32(s,tcg_dest,uVar6,tcg_op_1._4_4_,local_21c);
              if (m == 1) {
                gen_helper_neon_qrdmlah_s16
                          (tcg_ctx_00,tcg_dest,tcg_ctx_00->cpu_env,pTVar14,pTVar13,tcg_dest);
              }
              else {
                gen_helper_neon_qrdmlah_s32
                          (tcg_ctx_00,tcg_dest,tcg_ctx_00->cpu_env,pTVar14,pTVar13,tcg_dest);
              }
              break;
            case 0x1e:
              if (bVar15) {
                local_23c = m;
              }
              else {
                local_23c = MO_32;
              }
              read_vec_element_i32(s,tcg_dest,uVar6,tcg_op_1._4_4_,local_23c);
              if (m == 1) {
                gen_helper_neon_qrdmlsh_s16
                          (tcg_ctx_00,tcg_dest,tcg_ctx_00->cpu_env,pTVar14,pTVar13,tcg_dest);
              }
              else {
                gen_helper_neon_qrdmlsh_s32
                          (tcg_ctx_00,tcg_dest,tcg_ctx_00->cpu_env,pTVar14,pTVar13,tcg_dest);
              }
            }
            if (bVar15) {
              write_fp_sreg(s,uVar6,tcg_dest);
            }
            else {
              write_vec_element_i32(s,tcg_dest,uVar6,tcg_op_1._4_4_,MO_32);
            }
            tcg_temp_free_i32(tcg_ctx_00,pTVar14);
            tcg_temp_free_i32(tcg_ctx_00,tcg_dest);
          }
          tcg_temp_free_i32(tcg_ctx_00,pTVar13);
          clear_vec_high(s,is_q_00,uVar6);
        }
LAB_00833391:
        if (_data == (TCGv_ptr)0x0) {
          return;
        }
        tcg_temp_free_ptr(tcg_ctx_00,_data);
        return;
      }
    }
    pcVar9 = gen_helper_gvec_sdot_idx_b;
    if (bVar16) {
      pcVar9 = gen_helper_gvec_udot_idx_b;
    }
    gen_gvec_op3_ool(s,is_q_00,uVar6,uVar5,h,fpst._4_4_,pcVar9);
  }
  return;
}

Assistant:

static void disas_simd_indexed(DisasContext *s, uint32_t insn)
{
    TCGContext *tcg_ctx = s->uc->tcg_ctx;
    /* This encoding has two kinds of instruction:
     *  normal, where we perform elt x idxelt => elt for each
     *     element in the vector
     *  long, where we perform elt x idxelt and generate a result of
     *     double the width of the input element
     * The long ops have a 'part' specifier (ie come in INSN, INSN2 pairs).
     */
    bool is_scalar = extract32(insn, 28, 1);
    bool is_q = extract32(insn, 30, 1);
    bool u = extract32(insn, 29, 1);
    int size = extract32(insn, 22, 2);
    int l = extract32(insn, 21, 1);
    int m = extract32(insn, 20, 1);
    /* Note that the Rm field here is only 4 bits, not 5 as it usually is */
    int rm = extract32(insn, 16, 4);
    int opcode = extract32(insn, 12, 4);
    int h = extract32(insn, 11, 1);
    int rn = extract32(insn, 5, 5);
    int rd = extract32(insn, 0, 5);
    bool is_long = false;
    int is_fp = 0;
    bool is_fp16 = false;
    int index;
    TCGv_ptr fpst;

    switch (16 * u + opcode) {
    case 0x08: /* MUL */
    case 0x10: /* MLA */
    case 0x14: /* MLS */
        if (is_scalar) {
            unallocated_encoding(s);
            return;
        }
        break;
    case 0x02: /* SMLAL, SMLAL2 */
    case 0x12: /* UMLAL, UMLAL2 */
    case 0x06: /* SMLSL, SMLSL2 */
    case 0x16: /* UMLSL, UMLSL2 */
    case 0x0a: /* SMULL, SMULL2 */
    case 0x1a: /* UMULL, UMULL2 */
        if (is_scalar) {
            unallocated_encoding(s);
            return;
        }
        is_long = true;
        break;
    case 0x03: /* SQDMLAL, SQDMLAL2 */
    case 0x07: /* SQDMLSL, SQDMLSL2 */
    case 0x0b: /* SQDMULL, SQDMULL2 */
        is_long = true;
        break;
    case 0x0c: /* SQDMULH */
    case 0x0d: /* SQRDMULH */
        break;
    case 0x01: /* FMLA */
    case 0x05: /* FMLS */
    case 0x09: /* FMUL */
    case 0x19: /* FMULX */
        is_fp = 1;
        break;
    case 0x1d: /* SQRDMLAH */
    case 0x1f: /* SQRDMLSH */
        if (!dc_isar_feature(aa64_rdm, s)) {
            unallocated_encoding(s);
            return;
        }
        break;
    case 0x0e: /* SDOT */
    case 0x1e: /* UDOT */
        if (is_scalar || size != MO_32 || !dc_isar_feature(aa64_dp, s)) {
            unallocated_encoding(s);
            return;
        }
        break;
    case 0x11: /* FCMLA #0 */
    case 0x13: /* FCMLA #90 */
    case 0x15: /* FCMLA #180 */
    case 0x17: /* FCMLA #270 */
        if (is_scalar || !dc_isar_feature(aa64_fcma, s)) {
            unallocated_encoding(s);
            return;
        }
        is_fp = 2;
        break;
    case 0x00: /* FMLAL */
    case 0x04: /* FMLSL */
    case 0x18: /* FMLAL2 */
    case 0x1c: /* FMLSL2 */
        if (is_scalar || size != MO_32 || !dc_isar_feature(aa64_fhm, s)) {
            unallocated_encoding(s);
            return;
        }
        size = MO_16;
        /* is_fp, but we pass tcg_ctx->cpu_env not fp_status.  */
        break;
    default:
        unallocated_encoding(s);
        return;
    }

    switch (is_fp) {
    case 1: /* normal fp */
        /* convert insn encoded size to MemOp size */
        switch (size) {
        case 0: /* half-precision */
            size = MO_16;
            is_fp16 = true;
            break;
        case MO_32: /* single precision */
        case MO_64: /* double precision */
            break;
        default:
            unallocated_encoding(s);
            return;
        }
        break;

    case 2: /* complex fp */
        /* Each indexable element is a complex pair.  */
        size += 1;
        switch (size) {
        case MO_32:
            if (h && !is_q) {
                unallocated_encoding(s);
                return;
            }
            is_fp16 = true;
            break;
        case MO_64:
            break;
        default:
            unallocated_encoding(s);
            return;
        }
        break;

    default: /* integer */
        switch (size) {
        case MO_8:
        case MO_64:
            unallocated_encoding(s);
            return;
        }
        break;
    }
    if (is_fp16 && !dc_isar_feature(aa64_fp16, s)) {
        unallocated_encoding(s);
        return;
    }

    /* Given MemOp size, adjust register and indexing.  */
    switch (size) {
    case MO_16:
        index = h << 2 | l << 1 | m;
        break;
    case MO_32:
        index = h << 1 | l;
        rm |= m << 4;
        break;
    case MO_64:
        if (l || !is_q) {
            unallocated_encoding(s);
            return;
        }
        index = h;
        rm |= m << 4;
        break;
    default:
        g_assert_not_reached();
    }

    if (!fp_access_check(s)) {
        return;
    }

    if (is_fp) {
        fpst = get_fpstatus_ptr(tcg_ctx, is_fp16);
    } else {
        fpst = NULL;
    }

    switch (16 * u + opcode) {
    case 0x0e: /* SDOT */
    case 0x1e: /* UDOT */
        gen_gvec_op3_ool(s, is_q, rd, rn, rm, index,
                         u ? gen_helper_gvec_udot_idx_b
                         : gen_helper_gvec_sdot_idx_b);
        return;
    case 0x11: /* FCMLA #0 */
    case 0x13: /* FCMLA #90 */
    case 0x15: /* FCMLA #180 */
    case 0x17: /* FCMLA #270 */
        {
            int rot = extract32(insn, 13, 2);
            int data = (index << 2) | rot;
            tcg_gen_gvec_3_ptr(tcg_ctx, vec_full_reg_offset(s, rd),
                               vec_full_reg_offset(s, rn),
                               vec_full_reg_offset(s, rm), fpst,
                               is_q ? 16 : 8, vec_full_reg_size(s), data,
                               size == MO_64
                               ? gen_helper_gvec_fcmlas_idx
                               : gen_helper_gvec_fcmlah_idx);
            tcg_temp_free_ptr(tcg_ctx, fpst);
        }
        return;

    case 0x00: /* FMLAL */
    case 0x04: /* FMLSL */
    case 0x18: /* FMLAL2 */
    case 0x1c: /* FMLSL2 */
        {
            int is_s = extract32(opcode, 2, 1);
            int is_2 = u;
            int data = (index << 2) | (is_2 << 1) | is_s;
            tcg_gen_gvec_3_ptr(tcg_ctx, vec_full_reg_offset(s, rd),
                               vec_full_reg_offset(s, rn),
                               vec_full_reg_offset(s, rm), tcg_ctx->cpu_env,
                               is_q ? 16 : 8, vec_full_reg_size(s),
                               data, gen_helper_gvec_fmlal_idx_a64);
        }
        return;
    }

    if (size == 3) {
        TCGv_i64 tcg_idx = tcg_temp_new_i64(tcg_ctx);
        int pass;

        assert(is_fp && is_q && !is_long);

        read_vec_element(s, tcg_idx, rm, index, MO_64);

        for (pass = 0; pass < (is_scalar ? 1 : 2); pass++) {
            TCGv_i64 tcg_op = tcg_temp_new_i64(tcg_ctx);
            TCGv_i64 tcg_res = tcg_temp_new_i64(tcg_ctx);

            read_vec_element(s, tcg_op, rn, pass, MO_64);

            switch (16 * u + opcode) {
            case 0x05: /* FMLS */
                /* As usual for ARM, separate negation for fused multiply-add */
                gen_helper_vfp_negd(tcg_ctx, tcg_op, tcg_op);
                /* fall through */
            case 0x01: /* FMLA */
                read_vec_element(s, tcg_res, rd, pass, MO_64);
                gen_helper_vfp_muladdd(tcg_ctx, tcg_res, tcg_op, tcg_idx, tcg_res, fpst);
                break;
            case 0x09: /* FMUL */
                gen_helper_vfp_muld(tcg_ctx, tcg_res, tcg_op, tcg_idx, fpst);
                break;
            case 0x19: /* FMULX */
                gen_helper_vfp_mulxd(tcg_ctx, tcg_res, tcg_op, tcg_idx, fpst);
                break;
            default:
                g_assert_not_reached();
            }

            write_vec_element(s, tcg_res, rd, pass, MO_64);
            tcg_temp_free_i64(tcg_ctx, tcg_op);
            tcg_temp_free_i64(tcg_ctx, tcg_res);
        }

        tcg_temp_free_i64(tcg_ctx, tcg_idx);
        clear_vec_high(s, !is_scalar, rd);
    } else if (!is_long) {
        /* 32 bit floating point, or 16 or 32 bit integer.
         * For the 16 bit scalar case we use the usual Neon helpers and
         * rely on the fact that 0 op 0 == 0 with no side effects.
         */
        TCGv_i32 tcg_idx = tcg_temp_new_i32(tcg_ctx);
        int pass, maxpasses;

        if (is_scalar) {
            maxpasses = 1;
        } else {
            maxpasses = is_q ? 4 : 2;
        }

        read_vec_element_i32(s, tcg_idx, rm, index, size);

        if (size == 1 && !is_scalar) {
            /* The simplest way to handle the 16x16 indexed ops is to duplicate
             * the index into both halves of the 32 bit tcg_idx and then use
             * the usual Neon helpers.
             */
            tcg_gen_deposit_i32(tcg_ctx, tcg_idx, tcg_idx, tcg_idx, 16, 16);
        }

        for (pass = 0; pass < maxpasses; pass++) {
            TCGv_i32 tcg_op = tcg_temp_new_i32(tcg_ctx);
            TCGv_i32 tcg_res = tcg_temp_new_i32(tcg_ctx);

            read_vec_element_i32(s, tcg_op, rn, pass, is_scalar ? size : MO_32);

            switch (16 * u + opcode) {
            case 0x08: /* MUL */
            case 0x10: /* MLA */
            case 0x14: /* MLS */
            {
                static NeonGenTwoOpFn * const fns[2][2] = {
                    { gen_helper_neon_add_u16, gen_helper_neon_sub_u16 },
                    { tcg_gen_add_i32, tcg_gen_sub_i32 },
                };
                NeonGenTwoOpFn *genfn;
                bool is_sub = opcode == 0x4;

                if (size == 1) {
                    gen_helper_neon_mul_u16(tcg_ctx, tcg_res, tcg_op, tcg_idx);
                } else {
                    tcg_gen_mul_i32(tcg_ctx, tcg_res, tcg_op, tcg_idx);
                }
                if (opcode == 0x8) {
                    break;
                }
                read_vec_element_i32(s, tcg_op, rd, pass, MO_32);
                genfn = fns[size - 1][is_sub];
                genfn(tcg_ctx, tcg_res, tcg_op, tcg_res);
                break;
            }
            case 0x05: /* FMLS */
            case 0x01: /* FMLA */
                read_vec_element_i32(s, tcg_res, rd, pass,
                                     is_scalar ? size : MO_32);
                switch (size) {
                case 1:
                    if (opcode == 0x5) {
                        /* As usual for ARM, separate negation for fused
                         * multiply-add */
                        tcg_gen_xori_i32(tcg_ctx, tcg_op, tcg_op, 0x80008000);
                    }
                    if (is_scalar) {
                        gen_helper_advsimd_muladdh(tcg_ctx, tcg_res, tcg_op, tcg_idx,
                                                   tcg_res, fpst);
                    } else {
                        gen_helper_advsimd_muladd2h(tcg_ctx, tcg_res, tcg_op, tcg_idx,
                                                    tcg_res, fpst);
                    }
                    break;
                case 2:
                    if (opcode == 0x5) {
                        /* As usual for ARM, separate negation for
                         * fused multiply-add */
                        tcg_gen_xori_i32(tcg_ctx, tcg_op, tcg_op, 0x80000000);
                    }
                    gen_helper_vfp_muladds(tcg_ctx, tcg_res, tcg_op, tcg_idx,
                                           tcg_res, fpst);
                    break;
                default:
                    g_assert_not_reached();
                }
                break;
            case 0x09: /* FMUL */
                switch (size) {
                case 1:
                    if (is_scalar) {
                        gen_helper_advsimd_mulh(tcg_ctx, tcg_res, tcg_op,
                                                tcg_idx, fpst);
                    } else {
                        gen_helper_advsimd_mul2h(tcg_ctx, tcg_res, tcg_op,
                                                 tcg_idx, fpst);
                    }
                    break;
                case 2:
                    gen_helper_vfp_muls(tcg_ctx, tcg_res, tcg_op, tcg_idx, fpst);
                    break;
                default:
                    g_assert_not_reached();
                }
                break;
            case 0x19: /* FMULX */
                switch (size) {
                case 1:
                    if (is_scalar) {
                        gen_helper_advsimd_mulxh(tcg_ctx, tcg_res, tcg_op,
                                                 tcg_idx, fpst);
                    } else {
                        gen_helper_advsimd_mulx2h(tcg_ctx, tcg_res, tcg_op,
                                                  tcg_idx, fpst);
                    }
                    break;
                case 2:
                    gen_helper_vfp_mulxs(tcg_ctx, tcg_res, tcg_op, tcg_idx, fpst);
                    break;
                default:
                    g_assert_not_reached();
                }
                break;
            case 0x0c: /* SQDMULH */
                if (size == 1) {
                    gen_helper_neon_qdmulh_s16(tcg_ctx, tcg_res, tcg_ctx->cpu_env,
                                               tcg_op, tcg_idx);
                } else {
                    gen_helper_neon_qdmulh_s32(tcg_ctx, tcg_res, tcg_ctx->cpu_env,
                                               tcg_op, tcg_idx);
                }
                break;
            case 0x0d: /* SQRDMULH */
                if (size == 1) {
                    gen_helper_neon_qrdmulh_s16(tcg_ctx, tcg_res, tcg_ctx->cpu_env,
                                                tcg_op, tcg_idx);
                } else {
                    gen_helper_neon_qrdmulh_s32(tcg_ctx, tcg_res, tcg_ctx->cpu_env,
                                                tcg_op, tcg_idx);
                }
                break;
            case 0x1d: /* SQRDMLAH */
                read_vec_element_i32(s, tcg_res, rd, pass,
                                     is_scalar ? size : MO_32);
                if (size == 1) {
                    gen_helper_neon_qrdmlah_s16(tcg_ctx, tcg_res, tcg_ctx->cpu_env,
                                                tcg_op, tcg_idx, tcg_res);
                } else {
                    gen_helper_neon_qrdmlah_s32(tcg_ctx, tcg_res, tcg_ctx->cpu_env,
                                                tcg_op, tcg_idx, tcg_res);
                }
                break;
            case 0x1f: /* SQRDMLSH */
                read_vec_element_i32(s, tcg_res, rd, pass,
                                     is_scalar ? size : MO_32);
                if (size == 1) {
                    gen_helper_neon_qrdmlsh_s16(tcg_ctx, tcg_res, tcg_ctx->cpu_env,
                                                tcg_op, tcg_idx, tcg_res);
                } else {
                    gen_helper_neon_qrdmlsh_s32(tcg_ctx, tcg_res, tcg_ctx->cpu_env,
                                                tcg_op, tcg_idx, tcg_res);
                }
                break;
            default:
                g_assert_not_reached();
            }

            if (is_scalar) {
                write_fp_sreg(s, rd, tcg_res);
            } else {
                write_vec_element_i32(s, tcg_res, rd, pass, MO_32);
            }

            tcg_temp_free_i32(tcg_ctx, tcg_op);
            tcg_temp_free_i32(tcg_ctx, tcg_res);
        }

        tcg_temp_free_i32(tcg_ctx, tcg_idx);
        clear_vec_high(s, is_q, rd);
    } else {
        /* long ops: 16x16->32 or 32x32->64 */
        TCGv_i64 tcg_res[2];
        int pass;
        bool satop = extract32(opcode, 0, 1);
        MemOp memop = MO_32;

        if (satop || !u) {
            memop |= MO_SIGN;
        }

        if (size == 2) {
            TCGv_i64 tcg_idx = tcg_temp_new_i64(tcg_ctx);

            read_vec_element(s, tcg_idx, rm, index, memop);

            for (pass = 0; pass < (is_scalar ? 1 : 2); pass++) {
                TCGv_i64 tcg_op = tcg_temp_new_i64(tcg_ctx);
                TCGv_i64 tcg_passres;
                int passelt;

                if (is_scalar) {
                    passelt = 0;
                } else {
                    passelt = pass + (is_q * 2);
                }

                read_vec_element(s, tcg_op, rn, passelt, memop);

                tcg_res[pass] = tcg_temp_new_i64(tcg_ctx);

                if (opcode == 0xa || opcode == 0xb) {
                    /* Non-accumulating ops */
                    tcg_passres = tcg_res[pass];
                } else {
                    tcg_passres = tcg_temp_new_i64(tcg_ctx);
                }

                tcg_gen_mul_i64(tcg_ctx, tcg_passres, tcg_op, tcg_idx);
                tcg_temp_free_i64(tcg_ctx, tcg_op);

                if (satop) {
                    /* saturating, doubling */
                    gen_helper_neon_addl_saturate_s64(tcg_ctx, tcg_passres, tcg_ctx->cpu_env,
                                                      tcg_passres, tcg_passres);
                }

                if (opcode == 0xa || opcode == 0xb) {
                    continue;
                }

                /* Accumulating op: handle accumulate step */
                read_vec_element(s, tcg_res[pass], rd, pass, MO_64);

                switch (opcode) {
                case 0x2: /* SMLAL, SMLAL2, UMLAL, UMLAL2 */
                    tcg_gen_add_i64(tcg_ctx, tcg_res[pass], tcg_res[pass], tcg_passres);
                    break;
                case 0x6: /* SMLSL, SMLSL2, UMLSL, UMLSL2 */
                    tcg_gen_sub_i64(tcg_ctx, tcg_res[pass], tcg_res[pass], tcg_passres);
                    break;
                case 0x7: /* SQDMLSL, SQDMLSL2 */
                    tcg_gen_neg_i64(tcg_ctx, tcg_passres, tcg_passres);
                    /* fall through */
                case 0x3: /* SQDMLAL, SQDMLAL2 */
                    gen_helper_neon_addl_saturate_s64(tcg_ctx, tcg_res[pass], tcg_ctx->cpu_env,
                                                      tcg_res[pass],
                                                      tcg_passres);
                    break;
                default:
                    g_assert_not_reached();
                }
                tcg_temp_free_i64(tcg_ctx, tcg_passres);
            }
            tcg_temp_free_i64(tcg_ctx, tcg_idx);

            clear_vec_high(s, !is_scalar, rd);
        } else {
            TCGv_i32 tcg_idx = tcg_temp_new_i32(tcg_ctx);

            assert(size == 1);
            read_vec_element_i32(s, tcg_idx, rm, index, size);

            if (!is_scalar) {
                /* The simplest way to handle the 16x16 indexed ops is to
                 * duplicate the index into both halves of the 32 bit tcg_idx
                 * and then use the usual Neon helpers.
                 */
                tcg_gen_deposit_i32(tcg_ctx, tcg_idx, tcg_idx, tcg_idx, 16, 16);
            }

            for (pass = 0; pass < (is_scalar ? 1 : 2); pass++) {
                TCGv_i32 tcg_op = tcg_temp_new_i32(tcg_ctx);
                TCGv_i64 tcg_passres;

                if (is_scalar) {
                    read_vec_element_i32(s, tcg_op, rn, pass, size);
                } else {
                    read_vec_element_i32(s, tcg_op, rn,
                                         pass + (is_q * 2), MO_32);
                }

                tcg_res[pass] = tcg_temp_new_i64(tcg_ctx);

                if (opcode == 0xa || opcode == 0xb) {
                    /* Non-accumulating ops */
                    tcg_passres = tcg_res[pass];
                } else {
                    tcg_passres = tcg_temp_new_i64(tcg_ctx);
                }

                if (memop & MO_SIGN) {
                    gen_helper_neon_mull_s16(tcg_ctx, tcg_passres, tcg_op, tcg_idx);
                } else {
                    gen_helper_neon_mull_u16(tcg_ctx, tcg_passres, tcg_op, tcg_idx);
                }
                if (satop) {
                    gen_helper_neon_addl_saturate_s32(tcg_ctx, tcg_passres, tcg_ctx->cpu_env,
                                                      tcg_passres, tcg_passres);
                }
                tcg_temp_free_i32(tcg_ctx, tcg_op);

                if (opcode == 0xa || opcode == 0xb) {
                    continue;
                }

                /* Accumulating op: handle accumulate step */
                read_vec_element(s, tcg_res[pass], rd, pass, MO_64);

                switch (opcode) {
                case 0x2: /* SMLAL, SMLAL2, UMLAL, UMLAL2 */
                    gen_helper_neon_addl_u32(tcg_ctx, tcg_res[pass], tcg_res[pass],
                                             tcg_passres);
                    break;
                case 0x6: /* SMLSL, SMLSL2, UMLSL, UMLSL2 */
                    gen_helper_neon_subl_u32(tcg_ctx, tcg_res[pass], tcg_res[pass],
                                             tcg_passres);
                    break;
                case 0x7: /* SQDMLSL, SQDMLSL2 */
                    gen_helper_neon_negl_u32(tcg_ctx, tcg_passres, tcg_passres);
                    /* fall through */
                case 0x3: /* SQDMLAL, SQDMLAL2 */
                    gen_helper_neon_addl_saturate_s32(tcg_ctx, tcg_res[pass], tcg_ctx->cpu_env,
                                                      tcg_res[pass],
                                                      tcg_passres);
                    break;
                default:
                    g_assert_not_reached();
                }
                tcg_temp_free_i64(tcg_ctx, tcg_passres);
            }
            tcg_temp_free_i32(tcg_ctx, tcg_idx);

            if (is_scalar) {
                tcg_gen_ext32u_i64(tcg_ctx, tcg_res[0], tcg_res[0]);
            }
        }

        if (is_scalar) {
            tcg_res[1] = tcg_const_i64(tcg_ctx, 0);
        }

        for (pass = 0; pass < 2; pass++) {
            write_vec_element(s, tcg_res[pass], rd, pass, MO_64);
            tcg_temp_free_i64(tcg_ctx, tcg_res[pass]);
        }
    }

    if (fpst) {
        tcg_temp_free_ptr(tcg_ctx, fpst);
    }
}